

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  SegmentReader *pSVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  Reader *pRVar9;
  uint uVar10;
  PointerType PVar11;
  CapTableReader *pCVar12;
  int iVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ArrayPtr<const_char> AVar18;
  DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
  _kjCondition;
  Fault f;
  undefined1 local_a8 [24];
  int iStack_90;
  undefined4 uStack_8c;
  StructDataBitCount local_88;
  StructPointerCount SStack_84;
  undefined2 uStack_82;
  int iStack_80;
  undefined4 uStack_7c;
  Reader *local_78;
  SegmentReader *local_70;
  WirePointer *local_68;
  Reader *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  WirePointer *local_48;
  int local_40;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  uVar15 = 0;
  uVar16 = 0;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  bVar14 = (decl->_reader).pointerCount == 0;
  local_48 = (decl->_reader).pointers;
  if (bVar14) {
    local_48 = (WirePointer *)0x0;
  }
  iVar13 = 0x7fffffff;
  local_40 = (decl->_reader).nestingLimit;
  if (bVar14) {
    local_40 = 0x7fffffff;
  }
  else {
    local_58._0_4_ = *(undefined4 *)&(decl->_reader).segment;
    local_58._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    uVar15 = *(undefined4 *)&(decl->_reader).capTable;
    uVar16 = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
  }
  uStack_50 = (CapTableReader *)CONCAT44(uVar16,uVar15);
  capnp::_::PointerReader::getStruct
            ((StructReader *)local_a8,(PointerReader *)&local_58,(word *)0x0);
  local_48 = (WirePointer *)0x0;
  local_40 = 0x7fffffff;
  if (SStack_84 != 0) {
    local_48 = (WirePointer *)CONCAT44(uStack_8c,iStack_90);
    local_40 = iStack_80;
  }
  uVar15._0_2_ = FILE;
  uVar15._2_2_ = FILE;
  local_58._4_4_ = 0;
  uVar16 = 0;
  uVar17 = 0;
  if (SStack_84 != 0) {
    uVar15 = local_a8._0_4_;
    local_58._4_4_ = local_a8._4_4_;
    uVar16 = local_a8._8_4_;
    uVar17 = local_a8._12_4_;
  }
  local_58._0_2_ = (Which)uVar15;
  local_58._2_2_ = SUB42(uVar15,2);
  uStack_50 = (CapTableReader *)CONCAT44(uVar17,uVar16);
  AVar18 = (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_58,(void *)0x0,0);
  (this->name).content = AVar18;
  pSVar4 = (decl->_reader).segment;
  pCVar12 = (decl->_reader).capTable;
  pvVar3 = (decl->_reader).data;
  pWVar5 = (decl->_reader).pointers;
  SVar6 = (decl->_reader).pointerCount;
  uVar7 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar8 = (decl->_reader).nestingLimit;
  uVar15 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar7;
  (this->declId)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar15;
  (this->declId)._reader.data = pvVar3;
  (this->declId)._reader.pointers = pWVar5;
  (this->declId)._reader.segment = pSVar4;
  (this->declId)._reader.capTable = pCVar12;
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  local_60 = &this->fieldType;
  local_a8._0_2_ = FILE;
  local_a8._2_2_ = FILE;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  local_78 = &this->fieldDefaultValue;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_a8._16_8_ = (WirePointer *)0x0;
  if (3 < (decl->_reader).pointerCount) {
    iVar13 = (decl->_reader).nestingLimit;
    local_a8._0_4_ = *(undefined4 *)&(decl->_reader).segment;
    local_a8._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
    local_a8._8_4_ = *(undefined4 *)&(decl->_reader).capTable;
    local_a8._12_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
    local_a8._16_8_ = (decl->_reader).pointers + 3;
  }
  iStack_90 = iVar13;
  capnp::_::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)local_a8,INLINE_COMPOSITE,(word *)0x0)
  ;
  uVar2 = (decl->_reader).dataSize;
  if (uVar2 < 0x40) {
    this->startByte = 0;
    uVar10 = 0;
  }
  else {
    pvVar3 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar3 + 4);
    uVar10 = 0;
    if (0x5f < uVar2) {
      uVar10 = *(uint *)((long)pvVar3 + 8);
    }
  }
  this->endByte = uVar10;
  local_a8._0_2_ = FILE;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  uVar2 = (decl->_reader).dataSize;
  if (0x1f < uVar2) {
    local_a8._0_2_ = *(Which *)((long)(decl->_reader).data + 2);
  }
  local_a8._2_2_ = FIELD;
  local_a8._8_8_ = " == ";
  local_a8._16_8_ = &DAT_00000005;
  iStack_90 = CONCAT31(iStack_90._1_3_,local_a8._0_2_ == FIELD);
  if (local_a8._0_2_ != FIELD) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x42f,FAILED,"decl.which() == Declaration::FIELD","_kjCondition,",
               (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
                *)local_a8);
    kj::_::Debug::Fault::fatal((Fault *)&local_58);
  }
  local_70 = (decl->_reader).segment;
  pCVar12 = (decl->_reader).capTable;
  local_68 = (decl->_reader).pointers;
  uVar1 = (decl->_reader).pointerCount;
  iVar13 = (decl->_reader).nestingLimit;
  if (uVar1 < 6) {
    local_40 = 0x7fffffff;
    uStack_50 = (CapTableReader *)0x0;
    local_48 = (WirePointer *)0x0;
    local_58 = (Exception *)0x0;
  }
  else {
    local_48 = local_68 + 5;
    uStack_50 = pCVar12;
    local_58 = (Exception *)local_70;
    local_40 = iVar13;
  }
  pvVar3 = (decl->_reader).data;
  capnp::_::PointerReader::getStruct
            ((StructReader *)local_a8,(PointerReader *)&local_58,(word *)0x0);
  pRVar9 = local_78;
  (local_60->_reader).dataSize = local_88;
  (local_60->_reader).pointerCount = SStack_84;
  *(undefined2 *)&(local_60->_reader).field_0x26 = uStack_82;
  *(ulong *)&(local_60->_reader).nestingLimit = CONCAT44(uStack_7c,iStack_80);
  (local_60->_reader).data = (void *)local_a8._16_8_;
  (local_60->_reader).pointers = (WirePointer *)CONCAT44(uStack_8c,iStack_90);
  (local_60->_reader).segment = (SegmentReader *)local_a8._0_8_;
  (local_60->_reader).capTable = (CapTableReader *)local_a8._8_8_;
  if ((0x6f < uVar2) && (*(short *)((long)pvVar3 + 0xc) == 1)) {
    this->hasDefaultValue = true;
    if (uVar1 < 7) {
      iVar13 = 0x7fffffff;
      pCVar12 = (CapTableReader *)0x0;
      local_48 = (WirePointer *)0x0;
      local_58 = (Exception *)0x0;
    }
    else {
      local_48 = local_68 + 6;
      local_58 = (Exception *)local_70;
    }
    uStack_50 = pCVar12;
    local_40 = iVar13;
    capnp::_::PointerReader::getStruct
              ((StructReader *)local_a8,(PointerReader *)&local_58,(word *)0x0);
    (pRVar9->_reader).dataSize = local_88;
    (pRVar9->_reader).pointerCount = SStack_84;
    *(undefined2 *)&(pRVar9->_reader).field_0x26 = uStack_82;
    *(ulong *)&(pRVar9->_reader).nestingLimit = CONCAT44(uStack_7c,iStack_80);
    (pRVar9->_reader).data = (void *)local_a8._16_8_;
    (pRVar9->_reader).pointers = (WirePointer *)CONCAT44(uStack_8c,iStack_90);
    (pRVar9->_reader).segment = (SegmentReader *)local_a8._0_8_;
    (pRVar9->_reader).capTable = (CapTableReader *)local_a8._8_8_;
  }
  if ((decl->_reader).pointerCount < 5) {
    local_a8._0_8_ = (SegmentReader *)0x0;
    local_a8._8_8_ = (CapTableReader *)0x0;
    local_a8._16_8_ = (WirePointer *)0x0;
    iStack_90 = 0x7fffffff;
  }
  else {
    local_a8._16_8_ = (decl->_reader).pointers + 4;
    iStack_90 = (decl->_reader).nestingLimit;
    local_a8._0_8_ = (decl->_reader).segment;
    local_a8._8_8_ = (decl->_reader).capTable;
  }
  PVar11 = capnp::_::PointerReader::getPointerType((PointerReader *)local_a8);
  if (PVar11 != NULL_) {
    bVar14 = (decl->_reader).pointerCount < 5;
    local_a8._16_8_ = (decl->_reader).pointers + 4;
    if (bVar14) {
      local_a8._16_8_ = (WirePointer *)0x0;
    }
    iStack_90 = (decl->_reader).nestingLimit;
    if (bVar14) {
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      iStack_90 = 0x7fffffff;
    }
    else {
      local_a8._0_4_ = *(undefined4 *)&(decl->_reader).segment;
      local_a8._4_4_ = *(undefined4 *)((long)&(decl->_reader).segment + 4);
      local_a8._8_4_ = *(undefined4 *)&(decl->_reader).capTable;
      local_a8._12_4_ = *(undefined4 *)((long)&(decl->_reader).capTable + 4);
    }
    AVar18 = (ArrayPtr<const_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_a8,(void *)0x0,0);
    if ((this->docComment).ptr.isSet == true) {
      (this->docComment).ptr.isSet = false;
    }
    (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar18;
    (this->docComment).ptr.isSet = true;
  }
  return;
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }